

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

void __thiscall iDynTree::AttitudeQuaternionEKF::ekf_h(AttitudeQuaternionEKF *this)

{
  VectorDynSize *in_stack_00000188;
  VectorDynSize *in_stack_00000190;
  AttitudeQuaternionEKF *in_stack_00000198;
  
  ekf_h(in_stack_00000198,in_stack_00000190,in_stack_00000188);
  return;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekf_h(const iDynTree::VectorDynSize& xhat_k_plus_one, iDynTree::VectorDynSize& zhat_k_plus_one)
{
    if (xhat_k_plus_one.size() != m_x.size())
    {
        reportError("AttitudeQuaternionEKF", "h", "predicted state size mismatch");
        return false;
    }

    if (zhat_k_plus_one.size() != m_y.size())
    {
        reportError("AttitudeQuaternionEKF", "h", "output size mismatch");
        return false;
    }

    // following computation is the same as R^T e_3
    iDynTree::UnitQuaternion q;
    toEigen(q) = toEigen(xhat_k_plus_one).block<4,1>(0, 0);
    double q1q3{q(1)*q(3)};
    double q0q2{q(0)*q(2)};
    double q2q3{q(2)*q(3)};
    double q0q1{q(0)*q(1)};
    double q0squared{q(0)*q(0)};
    double q1squared{q(1)*q(1)};
    double q2squared{q(2)*q(2)};
    double q3squared{q(3)*q(3)};

    zhat_k_plus_one(0) = -2*(q1q3 - q0q2);
    zhat_k_plus_one(1) = -2*(q2q3 + q0q1);
    zhat_k_plus_one(2) = -(q0squared - q1squared - q2squared + q3squared);
    if (m_gravity_direction(2) == -1)
    {
        // have same zhat
    }
    else if (m_gravity_direction(2) == 1)
    {
        toEigen(zhat_k_plus_one) *= -1;
    }
    else
    {
        reportError("AttitudeQuaternionEKF", "h", "filter assumes gravity pointing upward or downward only");
        return false;
    }

    // magnetometer measurement gives us yaw
    if (m_output_size == output_dimensions_with_magnetometer)
    {
        double q0q3{q(0)*q(3)};
        double q1q2{q(1)*q(2)};
        zhat_k_plus_one(3) = std::atan2(2*(q0q3+q1q2), 1 - 2*(q2squared + q3squared));
    }

    return true;
}